

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O1

void duckdb_destroy_arrow(duckdb_arrow *result)

{
  duckdb_arrow p_Var1;
  ArrowResultWrapper *wrapper;
  
  p_Var1 = *result;
  if (p_Var1 != (duckdb_arrow)0x0) {
    std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
               (p_Var1 + 8));
    if (*(long **)p_Var1 != (long *)0x0) {
      (**(code **)(**(long **)p_Var1 + 8))();
    }
    *(long *)p_Var1 = 0;
    operator_delete(p_Var1);
    *result = (duckdb_arrow)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_arrow(duckdb_arrow *result) {
	if (*result) {
		auto wrapper = reinterpret_cast<ArrowResultWrapper *>(*result);
		delete wrapper;
		*result = nullptr;
	}
}